

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O2

bool __thiscall Omega_h::any::is_typed(any *this,type_info *t)

{
  bool bVar1;
  type_info *this_00;
  
  if (this->vtable == (vtable_type *)0x0) {
    this_00 = (type_info *)&void::typeinfo;
  }
  else {
    this_00 = (*this->vtable->type)();
  }
  bVar1 = std::type_info::operator==(this_00,t);
  return bVar1;
}

Assistant:

bool is_typed(const std::type_info& t) const {
    return is_same(this->type(), t);
  }